

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3DestroyMethod(sqlite3_vtab *pVtab)

{
  undefined8 uVar1;
  char *pcVar2;
  int local_5c;
  sqlite3 *db;
  char *zDb;
  sqlite3_vtab *psStack_40;
  int rc;
  Fts3Table *p;
  sqlite3_vtab *pVtab_local;
  
  zDb._4_4_ = 0;
  uVar1 = *(undefined8 *)&pVtab[1].nRef;
  pcVar2 = "";
  if (*(long *)&pVtab[3].nRef != 0) {
    pcVar2 = "--";
  }
  psStack_40 = pVtab;
  p = (Fts3Table *)pVtab;
  fts3DbExec((int *)((long)&zDb + 4),(sqlite3 *)pVtab[1].pModule,
             "DROP TABLE IF EXISTS %Q.\'%q_segments\';DROP TABLE IF EXISTS %Q.\'%q_segdir\';DROP TABLE IF EXISTS %Q.\'%q_docsize\';DROP TABLE IF EXISTS %Q.\'%q_stat\';%s DROP TABLE IF EXISTS %Q.\'%q_content\';"
             ,uVar1,pVtab[1].zErrMsg,uVar1,pVtab[1].zErrMsg,uVar1,pVtab[1].zErrMsg,uVar1,
             pVtab[1].zErrMsg,pcVar2,uVar1,pVtab[1].zErrMsg);
  if (zDb._4_4_ == 0) {
    local_5c = fts3DisconnectMethod(&p->base);
  }
  else {
    local_5c = zDb._4_4_;
  }
  return local_5c;
}

Assistant:

static int fts3DestroyMethod(sqlite3_vtab *pVtab){
  Fts3Table *p = (Fts3Table *)pVtab;
  int rc = SQLITE_OK;              /* Return code */
  const char *zDb = p->zDb;        /* Name of database (e.g. "main", "temp") */
  sqlite3 *db = p->db;             /* Database handle */

  /* Drop the shadow tables */
  fts3DbExec(&rc, db, 
    "DROP TABLE IF EXISTS %Q.'%q_segments';"
    "DROP TABLE IF EXISTS %Q.'%q_segdir';"
    "DROP TABLE IF EXISTS %Q.'%q_docsize';"
    "DROP TABLE IF EXISTS %Q.'%q_stat';"
    "%s DROP TABLE IF EXISTS %Q.'%q_content';",
    zDb, p->zName,
    zDb, p->zName,
    zDb, p->zName,
    zDb, p->zName,
    (p->zContentTbl ? "--" : ""), zDb,p->zName
  );

  /* If everything has worked, invoke fts3DisconnectMethod() to free the
  ** memory associated with the Fts3Table structure and return SQLITE_OK.
  ** Otherwise, return an SQLite error code.
  */
  return (rc==SQLITE_OK ? fts3DisconnectMethod(pVtab) : rc);
}